

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O3

int main(void)

{
  pointer pbVar1;
  OssAdminCreateOssVpcRequestType *this;
  HttpTestListener *pHVar2;
  undefined8 extraout_RAX;
  OssAdminBindBucketVipResponseType resp;
  OssAdminBindBucketVipRequestType req;
  string local_238;
  long *local_218;
  undefined8 local_210;
  long local_208;
  undefined1 local_200;
  undefined1 local_1ff;
  long *local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  undefined1 local_1e0;
  undefined7 *local_1d8;
  undefined8 local_1d0;
  undefined7 local_1c8;
  undefined4 uStack_1c1;
  undefined1 local_1bd;
  undefined1 local_1b8 [24];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188;
  undefined7 uStack_187;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  string local_150;
  undefined1 local_130 [32];
  _Alloc_hider local_110;
  undefined1 local_108 [24];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_130._0_8_ = local_130 + 0x10;
  local_130._8_8_ = (pointer)0x0;
  local_130[0x10] = '\0';
  local_110._M_p = local_108 + 8;
  local_108._0_8_ = 0;
  local_108[8] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0._M_p = (pointer)&local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  pbVar1 = (pointer)(local_1b8 + 0x10);
  local_1b8._8_8_ = (pointer)0x0;
  local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
  local_1c8 = 0x676e61682d6e63;
  uStack_1c1 = 0x756f687a;
  local_1d0 = 0xb;
  local_1bd = 0;
  local_1e8 = 0x64697070615f796d;
  local_1f0 = 8;
  local_1e0 = 0;
  local_208 = 0x65726365735f796d;
  local_200 = 0x74;
  local_210 = 9;
  local_1ff = 0;
  local_218 = &local_208;
  local_1f8 = &local_1e8;
  local_1d8 = &local_1c8;
  local_1b8._0_8_ = pbVar1;
  local_50._M_p = (pointer)&local_40;
  this = (OssAdminCreateOssVpcRequestType *)
         aliyun::OssAdmin::CreateOssAdminClient(&local_1d8,&local_1f8,&local_218);
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
  }
  if (this == (OssAdminCreateOssVpcRequestType *)0x0) {
    if ((pointer)local_1b8._0_8_ != pbVar1) {
      operator_delete((void *)local_1b8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
    }
    aliyun::OssAdminBindBucketVipRequestType::~OssAdminBindBucketVipRequestType
              ((OssAdminBindBucketVipRequestType *)local_130);
    local_130._0_8_ = local_130 + 0x10;
    local_130._8_8_ = (pointer)0x0;
    local_130[0x10] = '\0';
    local_110._M_p = local_108 + 8;
    local_108._0_8_ = 0;
    local_108[8] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_1b8._8_8_ = (pointer)0x0;
    local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
    local_198._8_8_ = 0;
    local_188 = 0;
    local_178 = &local_168;
    local_170 = 0;
    local_168 = 0;
    local_1c8 = 0x676e61682d6e63;
    uStack_1c1 = 0x756f687a;
    local_1d0 = 0xb;
    local_1bd = 0;
    local_1e8 = 0x64697070615f796d;
    local_1f0 = 8;
    local_1e0 = 0;
    local_208 = 0x65726365735f796d;
    local_200 = 0x74;
    local_210 = 9;
    local_1ff = 0;
    local_218 = &local_208;
    local_1f8 = &local_1e8;
    local_1d8 = &local_1c8;
    local_1b8._0_8_ = pbVar1;
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_50._M_p = (pointer)&local_40;
    this = (OssAdminCreateOssVpcRequestType *)aliyun::OssAdmin::CreateOssAdminClient();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
    }
    if (this != (OssAdminCreateOssVpcRequestType *)0x0) goto LAB_001059c8;
    if (local_178 != &local_168) {
      operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
    }
    if ((undefined1 *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,CONCAT71(uStack_187,local_188) + 1);
    }
    if ((pointer)local_1b8._0_8_ != pbVar1) {
      operator_delete((void *)local_1b8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
    }
    aliyun::OssAdminCreateImgVpcRequestType::~OssAdminCreateImgVpcRequestType
              ((OssAdminCreateImgVpcRequestType *)local_130);
    local_130._0_8_ = local_130 + 0x10;
    local_130._8_8_ = (pointer)0x0;
    local_130[0x10] = '\0';
    local_110._M_p = local_108 + 8;
    local_108._0_8_ = 0;
    local_108[8] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_1b8._8_8_ = (pointer)0x0;
    local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
    local_198._8_8_ = 0;
    local_188 = 0;
    local_178 = &local_168;
    local_170 = 0;
    local_168 = 0;
    local_1c8 = 0x676e61682d6e63;
    uStack_1c1 = 0x756f687a;
    local_1d0 = 0xb;
    local_1bd = 0;
    local_1e8 = 0x64697070615f796d;
    local_1f0 = 8;
    local_1e0 = 0;
    local_208 = 0x65726365735f796d;
    local_200 = 0x74;
    local_210 = 9;
    local_1ff = 0;
    local_218 = &local_208;
    local_1f8 = &local_1e8;
    local_1d8 = &local_1c8;
    local_1b8._0_8_ = pbVar1;
    local_198._M_allocated_capacity = (size_type)&local_188;
    this = (OssAdminCreateOssVpcRequestType *)aliyun::OssAdmin::CreateOssAdminClient();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
    }
    if (this != (OssAdminCreateOssVpcRequestType *)0x0) goto LAB_00105b60;
    if (local_178 != &local_168) {
      operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
    }
    if ((undefined1 *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,CONCAT71(uStack_187,local_188) + 1);
    }
    if ((pointer)local_1b8._0_8_ != pbVar1) {
      operator_delete((void *)local_1b8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
    }
    aliyun::OssAdminCreateOssVpcRequestType::~OssAdminCreateOssVpcRequestType
              ((OssAdminCreateOssVpcRequestType *)local_130);
    local_130._0_8_ = local_130 + 0x10;
    local_130._8_8_ = (pointer)0x0;
    local_130[0x10] = '\0';
    local_110._M_p = local_108 + 8;
    local_108._0_8_ = 0;
    local_108[8] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_1b8._8_8_ = (pointer)0x0;
    local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
    local_1c8 = 0x676e61682d6e63;
    uStack_1c1 = 0x756f687a;
    local_1d0 = 0xb;
    local_1bd = 0;
    local_1e8 = 0x64697070615f796d;
    local_1f0 = 8;
    local_1e0 = 0;
    local_208 = 0x65726365735f796d;
    local_200 = 0x74;
    local_210 = 9;
    local_1ff = 0;
    local_218 = &local_208;
    local_1f8 = &local_1e8;
    local_1d8 = &local_1c8;
    local_1b8._0_8_ = pbVar1;
    this = (OssAdminCreateOssVpcRequestType *)aliyun::OssAdmin::CreateOssAdminClient();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
    }
    if (this != (OssAdminCreateOssVpcRequestType *)0x0) goto LAB_00105cf8;
    if ((pointer)local_1b8._0_8_ != pbVar1) {
      operator_delete((void *)local_1b8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
    }
    aliyun::OssAdminDeleteImgVpcRequestType::~OssAdminDeleteImgVpcRequestType
              ((OssAdminDeleteImgVpcRequestType *)local_130);
    local_130._0_8_ = local_130 + 0x10;
    local_130._8_8_ = (pointer)0x0;
    local_130[0x10] = '\0';
    local_110._M_p = local_108 + 8;
    local_108._0_8_ = 0;
    local_108[8] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_1b8._8_8_ = (pointer)0x0;
    local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
    local_1c8 = 0x676e61682d6e63;
    uStack_1c1 = 0x756f687a;
    local_1d0 = 0xb;
    local_1bd = 0;
    local_1e8 = 0x64697070615f796d;
    local_1f0 = 8;
    local_1e0 = 0;
    local_208 = 0x65726365735f796d;
    local_200 = 0x74;
    local_210 = 9;
    local_1ff = 0;
    local_218 = &local_208;
    local_1f8 = &local_1e8;
    local_1d8 = &local_1c8;
    local_1b8._0_8_ = pbVar1;
    this = (OssAdminCreateOssVpcRequestType *)aliyun::OssAdmin::CreateOssAdminClient();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
    }
    if (this != (OssAdminCreateOssVpcRequestType *)0x0) goto LAB_00105e7f;
    if ((pointer)local_1b8._0_8_ != pbVar1) {
      operator_delete((void *)local_1b8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
    }
    aliyun::OssAdminDeleteOssVpcRequestType::~OssAdminDeleteOssVpcRequestType
              ((OssAdminDeleteOssVpcRequestType *)local_130);
    local_130._0_8_ = local_130 + 0x10;
    local_130._8_8_ = (pointer)0x0;
    local_130[0x10] = '\0';
    local_110._M_p = local_108 + 8;
    local_108._0_8_ = 0;
    local_108[8] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_1b8._16_8_ = (pointer)0x0;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
    local_1c8 = 0x676e61682d6e63;
    uStack_1c1 = 0x756f687a;
    local_1d0 = 0xb;
    local_1bd = 0;
    local_1e8 = 0x64697070615f796d;
    local_1f0 = 8;
    local_1e0 = 0;
    local_208 = 0x65726365735f796d;
    local_200 = 0x74;
    local_210 = 9;
    local_1ff = 0;
    local_218 = &local_208;
    local_1f8 = &local_1e8;
    local_1d8 = &local_1c8;
    local_1a0 = local_198._M_local_buf + 8;
    this = (OssAdminCreateOssVpcRequestType *)aliyun::OssAdmin::CreateOssAdminClient();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
    }
    if (this != (OssAdminCreateOssVpcRequestType *)0x0) goto LAB_00106006;
    if (local_1a0 != local_198._M_local_buf + 8) {
      operator_delete(local_1a0,local_198._8_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
    pbVar1 = (pointer)(local_1b8 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,
                      CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p,
                      CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p,
                      CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
    }
    if (local_110._M_p != local_108 + 8) {
      operator_delete(local_110._M_p,CONCAT71(local_108._9_7_,local_108[8]) + 1);
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
    }
    local_130._0_8_ = local_130 + 0x10;
    local_130._8_8_ = (pointer)0x0;
    local_130[0x10] = '\0';
    local_110._M_p = local_108 + 8;
    local_108._0_8_ = 0;
    local_108[8] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_1b8._8_8_ = (pointer)0x0;
    local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
    local_198._8_8_ = 0;
    local_188 = 0;
    local_178 = &local_168;
    local_170 = 0;
    local_168 = 0;
    local_1c8 = 0x676e61682d6e63;
    uStack_1c1 = 0x756f687a;
    local_1d0 = 0xb;
    local_1bd = 0;
    local_1e8 = 0x64697070615f796d;
    local_1f0 = 8;
    local_1e0 = 0;
    local_208 = 0x65726365735f796d;
    local_200 = 0x74;
    local_210 = 9;
    local_1ff = 0;
    local_218 = &local_208;
    local_1f8 = &local_1e8;
    local_1d8 = &local_1c8;
    local_1b8._0_8_ = pbVar1;
    local_198._M_allocated_capacity = (size_type)&local_188;
    this = (OssAdminCreateOssVpcRequestType *)aliyun::OssAdmin::CreateOssAdminClient();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
    }
    if (this != (OssAdminCreateOssVpcRequestType *)0x0) goto LAB_00106162;
    if (local_178 != &local_168) {
      operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
    }
    if ((undefined1 *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,CONCAT71(uStack_187,local_188) + 1);
    }
    if ((pointer)local_1b8._0_8_ != pbVar1) {
      operator_delete((void *)local_1b8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
    }
    aliyun::OssAdminGetImgVpcInfoRequestType::~OssAdminGetImgVpcInfoRequestType
              ((OssAdminGetImgVpcInfoRequestType *)local_130);
    local_130._0_8_ = local_130 + 0x10;
    local_130._8_8_ = (pointer)0x0;
    local_130[0x10] = '\0';
    local_110._M_p = local_108 + 8;
    local_108._0_8_ = 0;
    local_108[8] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_1b8._8_8_ = (pointer)0x0;
    local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
    local_198._8_8_ = 0;
    local_188 = 0;
    local_178 = &local_168;
    local_170 = 0;
    local_168 = 0;
    local_1c8 = 0x676e61682d6e63;
    uStack_1c1 = 0x756f687a;
    local_1d0 = 0xb;
    local_1bd = 0;
    local_1e8 = 0x64697070615f796d;
    local_1f0 = 8;
    local_1e0 = 0;
    local_208 = 0x65726365735f796d;
    local_200 = 0x74;
    local_210 = 9;
    local_1ff = 0;
    local_218 = &local_208;
    local_1f8 = &local_1e8;
    local_1d8 = &local_1c8;
    local_1b8._0_8_ = pbVar1;
    local_198._M_allocated_capacity = (size_type)&local_188;
    this = (OssAdminCreateOssVpcRequestType *)aliyun::OssAdmin::CreateOssAdminClient();
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
    }
    if (this == (OssAdminCreateOssVpcRequestType *)0x0) {
      if (local_178 != &local_168) {
        operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
      }
      if ((undefined1 *)local_198._M_allocated_capacity != &local_188) {
        operator_delete((void *)local_198._M_allocated_capacity,CONCAT71(uStack_187,local_188) + 1);
      }
      if ((pointer)local_1b8._0_8_ != pbVar1) {
        operator_delete((void *)local_1b8._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
      }
      aliyun::OssAdminGetOssVpcInfoRequestType::~OssAdminGetOssVpcInfoRequestType
                ((OssAdminGetOssVpcInfoRequestType *)local_130);
      local_130._0_8_ = local_130 + 0x10;
      local_130._8_8_ = (pointer)0x0;
      local_130[0x10] = '\0';
      local_110._M_p = local_108 + 8;
      local_108._0_8_ = 0;
      local_108[8] = '\0';
      local_f0._M_p = (pointer)&local_e0;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      local_d0._M_p = (pointer)&local_c0;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      local_b0._M_p = (pointer)&local_a0;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_90._M_p = (pointer)&local_80;
      local_88 = 0;
      local_80._M_local_buf[0] = '\0';
      local_70._M_p = (pointer)&local_60;
      local_68 = 0;
      local_60._M_local_buf[0] = '\0';
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_1c8 = 0x676e61682d6e63;
      local_1e8 = 0x64697070615f796d;
      local_208 = 0x65726365735f796d;
      local_1b8._8_8_ = (pointer)0x0;
      local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
      uStack_1c1 = 0x756f687a;
      local_1d0 = 0xb;
      local_1bd = 0;
      local_1f0 = 8;
      local_1e0 = 0;
      local_200 = 0x74;
      local_210 = 9;
      local_1ff = 0;
      local_218 = &local_208;
      local_1f8 = &local_1e8;
      local_1d8 = &local_1c8;
      local_1b8._0_8_ = pbVar1;
      local_50._M_p = (pointer)&local_40;
      this = (OssAdminCreateOssVpcRequestType *)aliyun::OssAdmin::CreateOssAdminClient();
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,CONCAT17((undefined1)uStack_1c1,local_1c8) + 1);
      }
      if (this == (OssAdminCreateOssVpcRequestType *)0x0) {
        if ((pointer)local_1b8._0_8_ != pbVar1) {
          operator_delete((void *)local_1b8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
        }
        aliyun::OssAdminUnBindBucketVipRequestType::~OssAdminUnBindBucketVipRequestType
                  ((OssAdminUnBindBucketVipRequestType *)local_130);
        return 0;
      }
      goto LAB_0010646a;
    }
  }
  else {
    local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_150.field_2._M_local_buf[7] = '.';
    local_150.field_2._8_7_ = 0x34333232313a31;
    local_150._M_string_length = 0xf;
    local_150.field_2._M_local_buf[0xf] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(((OssAdminCreateImgVpcRequestType *)this)->resource_owner_account)._M_string_length
        == '\x01') {
      *(undefined1 *)
       ((long)&(((OssAdminCreateImgVpcRequestType *)this)->resource_owner_account)._M_string_length
       + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"{  \"requestId\": \"requestId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_130,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_b0,"Region");
    std::__cxx11::string::operator=((string *)&local_90,"VpcId");
    std::__cxx11::string::operator=((string *)&local_70,"Vip");
    std::__cxx11::string::operator=((string *)&local_50,"BucketName");
    aliyun::OssAdmin::BindBucketVip
              ((OssAdminBindBucketVipRequestType *)this,
               (OssAdminBindBucketVipResponseType *)local_130,(OssAdminErrorInfo *)local_1b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_1();
LAB_001059c8:
    local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_150.field_2._M_local_buf[7] = '.';
    local_150.field_2._8_7_ = 0x34333232313a31;
    local_150._M_string_length = 0xf;
    local_150.field_2._M_local_buf[0xf] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(((OssAdminCreateImgVpcRequestType *)this)->resource_owner_account)._M_string_length
        == '\x01') {
      *(undefined1 *)
       ((long)&(((OssAdminCreateImgVpcRequestType *)this)->resource_owner_account)._M_string_length
       + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"requestId\": \"requestId\",  \"vip\": \"vip\",  \"vpcId\": \"vpcId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_130,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_b0,"Region");
    std::__cxx11::string::operator=((string *)&local_90,"VirtualSwitchId");
    std::__cxx11::string::operator=((string *)&local_70,"VpcId");
    std::__cxx11::string::operator=((string *)&local_50,"Label");
    aliyun::OssAdmin::CreateImgVpc
              ((OssAdminCreateImgVpcRequestType *)this,(OssAdminCreateImgVpcResponseType *)local_130
               ,(OssAdminErrorInfo *)local_1b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_2();
LAB_00105b60:
    local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_150.field_2._M_local_buf[7] = '.';
    local_150.field_2._8_7_ = 0x34333232313a31;
    local_150._M_string_length = 0xf;
    local_150.field_2._M_local_buf[0xf] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"requestId\": \"requestId\",  \"vip\": \"vip\",  \"vpcId\": \"vpcId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_130,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_b0,"Region");
    std::__cxx11::string::operator=((string *)&local_90,"VirtualSwitchId");
    std::__cxx11::string::operator=((string *)&local_70,"VpcId");
    std::__cxx11::string::operator=((string *)&local_50,"Label");
    aliyun::OssAdmin::CreateOssVpc
              (this,(OssAdminCreateOssVpcResponseType *)local_130,(OssAdminErrorInfo *)local_1b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_3();
LAB_00105cf8:
    local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_150.field_2._M_local_buf[7] = '.';
    local_150.field_2._8_7_ = 0x34333232313a31;
    local_150._M_string_length = 0xf;
    local_150.field_2._M_local_buf[0xf] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"{  \"requestId\": \"requestId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_130,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_b0,"Region");
    std::__cxx11::string::operator=((string *)&local_90,"VpcId");
    std::__cxx11::string::operator=((string *)&local_70,"Label");
    aliyun::OssAdmin::DeleteImgVpc
              ((OssAdminDeleteImgVpcRequestType *)this,(OssAdminDeleteImgVpcResponseType *)local_130
               ,(OssAdminErrorInfo *)local_1b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_4();
LAB_00105e7f:
    local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_150.field_2._M_local_buf[7] = '.';
    local_150.field_2._8_7_ = 0x34333232313a31;
    local_150._M_string_length = 0xf;
    local_150.field_2._M_local_buf[0xf] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"{  \"requestId\": \"requestId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_130,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_b0,"Region");
    std::__cxx11::string::operator=((string *)&local_90,"VpcId");
    std::__cxx11::string::operator=((string *)&local_70,"Label");
    aliyun::OssAdmin::DeleteOssVpc
              ((OssAdminDeleteOssVpcRequestType *)this,(OssAdminDeleteOssVpcResponseType *)local_130
               ,(OssAdminErrorInfo *)local_1b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_5();
LAB_00106006:
    local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_150.field_2._M_local_buf[7] = '.';
    local_150.field_2._8_7_ = 0x34333232313a31;
    local_150._M_string_length = 0xf;
    local_150.field_2._M_local_buf[0xf] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"vipList\": {    \"vip\": [      \"vip\"    ]  },  \"requestId\": \"requestId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar2,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_130,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_b0,"BucketName");
    aliyun::OssAdmin::GetBucketVips
              ((OssAdminGetBucketVipsRequestType *)this,
               (OssAdminGetBucketVipsResponseType *)local_130,(OssAdminErrorInfo *)local_1b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_6();
LAB_00106162:
    local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_150.field_2._M_local_buf[7] = '.';
    local_150.field_2._8_7_ = 0x34333232313a31;
    local_150._M_string_length = 0xf;
    local_150.field_2._M_local_buf[0xf] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,
               "{  \"requestId\": \"requestId\",  \"vip\": \"vip\",  \"vpcId\": \"vpcId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_130,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
    std::__cxx11::string::operator=((string *)&local_b0,"Region");
    std::__cxx11::string::operator=((string *)&local_90,"VpcId");
    std::__cxx11::string::operator=((string *)&local_70,"Label");
    aliyun::OssAdmin::GetImgVpcInfo
              ((OssAdminGetImgVpcInfoRequestType *)this,
               (OssAdminGetImgVpcInfoResponseType *)local_130,(OssAdminErrorInfo *)local_1b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_7();
  }
  local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_150.field_2._M_local_buf[7] = '.';
  local_150.field_2._8_7_ = 0x34333232313a31;
  local_150._M_string_length = 0xf;
  local_150.field_2._M_local_buf[0xf] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT17(local_150.field_2._M_local_buf[7],
                             local_150.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar2 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar2,0x2fca);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "{  \"requestId\": \"requestId\",  \"vip\": \"vip\",  \"vpcId\": \"vpcId\"}","");
  HttpTestListener::SetResponseBody(pHVar2,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  HttpTestListener::Start(pHVar2);
  std::__cxx11::string::operator=((string *)local_130,"OwnerId");
  std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
  std::__cxx11::string::operator=((string *)&local_b0,"Region");
  std::__cxx11::string::operator=((string *)&local_90,"VpcId");
  std::__cxx11::string::operator=((string *)&local_70,"Label");
  aliyun::OssAdmin::GetOssVpcInfo
            ((OssAdminGetOssVpcInfoRequestType *)this,(OssAdminGetOssVpcInfoResponseType *)local_130
             ,(OssAdminErrorInfo *)local_1b8);
  HttpTestListener::WaitComplete(pHVar2);
  main_cold_8();
LAB_0010646a:
  local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_150.field_2._M_local_buf[7] = '.';
  local_150.field_2._8_7_ = 0x34333232313a31;
  local_150._M_string_length = 0xf;
  local_150.field_2._M_local_buf[0xf] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT17(local_150.field_2._M_local_buf[7],
                             local_150.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar2 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar2,0x2fca);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"{  \"requestId\": \"requestId\"}","");
  HttpTestListener::SetResponseBody(pHVar2,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  HttpTestListener::Start(pHVar2);
  std::__cxx11::string::operator=((string *)local_130,"OwnerId");
  std::__cxx11::string::operator=((string *)&local_110,"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)&local_f0,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)&local_d0,"OwnerAccount");
  std::__cxx11::string::operator=((string *)&local_b0,"Region");
  std::__cxx11::string::operator=((string *)&local_90,"VpcId");
  std::__cxx11::string::operator=((string *)&local_70,"Vip");
  std::__cxx11::string::operator=((string *)&local_50,"BucketName");
  aliyun::OssAdmin::UnBindBucketVip
            ((OssAdminUnBindBucketVipRequestType *)this,
             (OssAdminUnBindBucketVipResponseType *)local_130,(OssAdminErrorInfo *)local_1b8);
  HttpTestListener::WaitComplete(pHVar2);
  main_cold_9();
  if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1b8._16_8_)->_M_p + 1));
  }
  aliyun::OssAdminUnBindBucketVipRequestType::~OssAdminUnBindBucketVipRequestType
            ((OssAdminUnBindBucketVipRequestType *)local_130);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_bind_bucket_vip();
  test_create_img_vpc();
  test_create_oss_vpc();
  test_delete_img_vpc();
  test_delete_oss_vpc();
  test_get_bucket_vips();
  test_get_img_vpc_info();
  test_get_oss_vpc_info();
  test_un_bind_bucket_vip();
}